

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scan.h
# Opt level: O2

void __thiscall
charls::jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy>::
initialize_quantization_lut
          (jls_codec<charls::lossless_traits<unsigned_short,_12>,_charls::decoder_strategy> *this)

{
  int8_t iVar1;
  pointer pcVar2;
  size_t i;
  ulong uVar3;
  
  if (((this->t1_ == 0x12) && (this->t2_ == 0x43)) && (this->t3_ == 0x114)) {
    pcVar2 = (pointer)(((ulong)(DAT_00146208 - quantization_lut_lossless_12) >> 1) +
                      quantization_lut_lossless_12);
  }
  else {
    std::vector<signed_char,_std::allocator<signed_char>_>::resize(&this->quantization_lut_,0x2000);
    for (uVar3 = 0;
        pcVar2 = (this->quantization_lut_).
                 super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                 super__Vector_impl_data._M_start,
        uVar3 < (ulong)((long)(this->quantization_lut_).
                              super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pcVar2); uVar3 = uVar3 + 1)
    {
      iVar1 = quantize_gradient_org(this,(int)uVar3 + -0x1000);
      (this->quantization_lut_).super__Vector_base<signed_char,_std::allocator<signed_char>_>.
      _M_impl.super__Vector_impl_data._M_start[uVar3] = iVar1;
    }
    pcVar2 = pcVar2 + 0x1000;
  }
  this->quantization_ = pcVar2;
  return;
}

Assistant:

void initialize_quantization_lut()
    {
        // for lossless mode with default parameters, we have precomputed the look up table for bit counts 8, 10, 12 and 16.
        if (traits_.near_lossless == 0 && traits_.maximum_sample_value == (1 << traits_.bits_per_pixel) - 1)
        {
            const jpegls_pc_parameters presets{compute_default(traits_.maximum_sample_value, traits_.near_lossless)};
            if (presets.threshold1 == t1_ && presets.threshold2 == t2_ && presets.threshold3 == t3_)
            {
                if (traits_.bits_per_pixel == 8)
                {
                    quantization_ = &quantization_lut_lossless_8[quantization_lut_lossless_8.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 10)
                {
                    quantization_ = &quantization_lut_lossless_10[quantization_lut_lossless_10.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 12)
                {
                    quantization_ = &quantization_lut_lossless_12[quantization_lut_lossless_12.size() / 2];
                    return;
                }
                if (traits_.bits_per_pixel == 16)
                {
                    quantization_ = &quantization_lut_lossless_16[quantization_lut_lossless_16.size() / 2];
                    return;
                }
            }
        }

        // Initialize the quantization lookup table dynamic.
        const int32_t range{1 << traits_.bits_per_pixel};
        quantization_lut_.resize(static_cast<size_t>(range) * 2);
        for (size_t i{}; i < quantization_lut_.size(); ++i)
        {
            quantization_lut_[i] = quantize_gradient_org(-range + static_cast<int32_t>(i));
        }

        quantization_ = &quantization_lut_[range];
    }